

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O0

int dbuf_put_self(DynBuf *s,size_t offset,size_t len)

{
  int iVar1;
  size_t in_RDX;
  DynBuf *in_RSI;
  long *in_RDI;
  int local_4;
  
  if (((ulong)in_RDI[2] < in_RDI[1] + in_RDX) && (iVar1 = dbuf_realloc(in_RSI,in_RDX), iVar1 != 0))
  {
    local_4 = -1;
  }
  else {
    memcpy((void *)(*in_RDI + in_RDI[1]),(void *)((long)&in_RSI->buf + *in_RDI),in_RDX);
    in_RDI[1] = in_RDX + in_RDI[1];
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int dbuf_put_self(DynBuf *s, size_t offset, size_t len)
{
    if (unlikely((s->size + len) > s->allocated_size)) {
        if (dbuf_realloc(s, s->size + len))
            return -1;
    }
    memcpy(s->buf + s->size, s->buf + offset, len);
    s->size += len;
    return 0;
}